

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.hpp
# Opt level: O0

string_t duckdb::FSSTPrimitives::DecompressValue
                   (void *duckdb_fsst_decoder,VectorStringBuffer *str_buffer,char *compressed_string
                   ,idx_t compressed_string_len)

{
  size_t size;
  data_ptr_t output;
  size_t in_RCX;
  uchar *in_RDX;
  VectorStringBuffer *in_RSI;
  duckdb_fsst_decoder_t *in_RDI;
  anon_union_16_2_67f50693_for_value aVar1;
  size_t decompressed_string_size;
  data_ptr_t target_ptr;
  uchar *compressed_string_ptr;
  duckdb_fsst_decoder_t *fsst_decoder;
  idx_t max_uncompressed_length;
  idx_t in_stack_ffffffffffffffa8;
  VectorStringBuffer *in_stack_ffffffffffffffb0;
  uchar *buffer;
  
  size = in_RCX << 3;
  buffer = in_RDX;
  output = VectorStringBuffer::AllocateShrinkableBuffer
                     (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  duckdb_fsst_decompress(in_RDI,in_RCX,in_RDX,size,output);
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       VectorStringBuffer::FinalizeShrinkableBuffer(in_RSI,buffer,in_RCX,size);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static string_t DecompressValue(void *duckdb_fsst_decoder, VectorStringBuffer &str_buffer,
	                                const char *compressed_string, const idx_t compressed_string_len) {
		const auto max_uncompressed_length = compressed_string_len * 8;
		const auto fsst_decoder = static_cast<duckdb_fsst_decoder_t *>(duckdb_fsst_decoder);
		const auto compressed_string_ptr = (const unsigned char *)compressed_string; // NOLINT
		const auto target_ptr = str_buffer.AllocateShrinkableBuffer(max_uncompressed_length);
		const auto decompressed_string_size = duckdb_fsst_decompress(
		    fsst_decoder, compressed_string_len, compressed_string_ptr, max_uncompressed_length, target_ptr);
		return str_buffer.FinalizeShrinkableBuffer(target_ptr, max_uncompressed_length, decompressed_string_size);
	}